

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_common.c
# Opt level: O0

LY_ERR lyd_dup_inst_next(lyd_node **inst,lyd_node *siblings,ly_ht **dup_inst_ht)

{
  lyd_dup_inst *set;
  ly_ctx *local_38;
  lyd_dup_inst *dup_inst;
  ly_ht **dup_inst_ht_local;
  lyd_node *siblings_local;
  lyd_node **inst_local;
  
  if (*inst == (lyd_node *)0x0) {
    inst_local._4_4_ = LY_SUCCESS;
  }
  else {
    set = lyd_dup_inst_get(*inst,dup_inst_ht);
    if (set == (lyd_dup_inst *)0x0) {
      if (siblings->schema == (lysc_node *)0x0) {
        local_38 = (ly_ctx *)siblings[2].schema;
      }
      else {
        local_38 = siblings->schema->module->ctx;
      }
      ly_log(local_38,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lyd_dup_inst_next");
      inst_local._4_4_ = LY_EMEM;
    }
    else {
      if ((set->used == 0) &&
         ((lyd_find_sibling_dup_inst_set(siblings,*inst,&set->set), set->set->count == 0 ||
          (*(set->set->field_2).dnodes != *inst)))) {
        __assert_fail("dup_inst->set->count && (dup_inst->set->dnodes[0] == *inst)",
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_common.c"
                      ,0x7c,
                      "LY_ERR lyd_dup_inst_next(struct lyd_node **, const struct lyd_node *, struct ly_ht **)"
                     );
      }
      if (set->used == set->set->count) {
        if (((*inst)->schema != (lysc_node *)0x0) &&
           ((((*inst)->schema->nodetype == 0x10 && (((*inst)->schema->flags & 0x200) != 0)) ||
            (((*inst)->schema->nodetype == 8 && (((*inst)->schema->flags & 1) == 0)))))) {
          *inst = (lyd_node *)0x0;
        }
      }
      else {
        if (set->set->count <= set->used) {
          __assert_fail("dup_inst->used < dup_inst->set->count",
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_common.c"
                        ,0x85,
                        "LY_ERR lyd_dup_inst_next(struct lyd_node **, const struct lyd_node *, struct ly_ht **)"
                       );
        }
        *inst = (set->set->field_2).dnodes[set->used];
        set->used = set->used + 1;
      }
      inst_local._4_4_ = LY_SUCCESS;
    }
  }
  return inst_local._4_4_;
}

Assistant:

LY_ERR
lyd_dup_inst_next(struct lyd_node **inst, const struct lyd_node *siblings, struct ly_ht **dup_inst_ht)
{
    struct lyd_dup_inst *dup_inst;

    if (!*inst) {
        /* no match, inst is unchanged */
        return LY_SUCCESS;
    }

    /* there can be more exact same instances (even if not allowed in invalid data) and we must make sure we do not
     * match a single node more times */
    dup_inst = lyd_dup_inst_get(*inst, dup_inst_ht);
    LY_CHECK_ERR_RET(!dup_inst, LOGMEM(LYD_CTX(siblings)), LY_EMEM);

    if (!dup_inst->used) {
        /* we did not cache these instances yet, do so */
        lyd_find_sibling_dup_inst_set(siblings, *inst, &dup_inst->set);
        assert(dup_inst->set->count && (dup_inst->set->dnodes[0] == *inst));
    }

    if (dup_inst->used == dup_inst->set->count) {
        if (lysc_is_dup_inst_list((*inst)->schema)) {
            /* we have used all the instances */
            *inst = NULL;
        } /* else just keep using the last (ideally only) instance */
    } else {
        assert(dup_inst->used < dup_inst->set->count);

        /* use another instance */
        *inst = dup_inst->set->dnodes[dup_inst->used];
        ++dup_inst->used;
    }

    return LY_SUCCESS;
}